

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O1

void __thiscall despot::Pocman::NewLevel(Pocman *this,PocmanState *pocstate)

{
  Grid<int> *this_00;
  pointer pCVar1;
  ulong *puVar2;
  pointer pCVar3;
  byte bVar4;
  undefined7 uVar5;
  int iVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong uVar9;
  int x;
  int y;
  double dVar10;
  
  uVar5 = *(undefined7 *)&this->field_0x3d;
  pocstate->pocman_pos = this->pocman_home_;
  *(undefined7 *)&pocstate->field_0x21 = uVar5;
  if (0 < this->num_ghosts_) {
    uVar7 = 0;
    do {
      *(undefined8 *)
       ((pocstate->ghost_pos).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
        _M_impl.super__Vector_impl_data._M_start + uVar7 * 8) = *(undefined8 *)&this->ghost_home_;
      pCVar3 = (pocstate->ghost_pos).
               super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar1 = pCVar3 + uVar7 * 8;
      *(uint *)pCVar1 = *(int *)pCVar1 + ((uint)uVar7 & 1);
      pCVar3 = pCVar3 + uVar7 * 8 + 4;
      *(uint *)pCVar3 = *(int *)pCVar3 + ((uint)(uVar7 >> 1) & 0x7fffffff);
      (pocstate->ghost_dir).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7] = -1;
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)this->num_ghosts_);
  }
  pocstate->num_food = 0;
  if (0 < (this->maze_).xsize_) {
    this_00 = &this->maze_;
    x = 0;
    do {
      if (0 < (this->maze_).ysize_) {
        y = 0;
        do {
          iVar6 = Grid<int>::Index(this_00,x,y);
          pbVar8 = (byte *)Grid<int>::operator()(this_00,x,y);
          uVar7 = (ulong)iVar6;
          if ((*pbVar8 & 2) == 0) {
LAB_00109655:
            uVar9 = uVar7 + 0x3f;
            if (-1 < (long)uVar7) {
              uVar9 = uVar7;
            }
            bVar4 = (byte)iVar6 & 0x3f;
            puVar2 = (pocstate->food).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     ((long)uVar9 >> 6) +
                     (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff
            ;
            *puVar2 = *puVar2 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
          }
          else {
            pbVar8 = (byte *)Grid<int>::operator()(this_00,x,y);
            if ((*pbVar8 & 4) == 0) {
              dVar10 = (double)despot::Random::NextDouble();
              if (this->food_prob_ <= dVar10) goto LAB_00109655;
            }
            uVar9 = uVar7 + 0x3f;
            if (-1 < (long)uVar7) {
              uVar9 = uVar7;
            }
            puVar2 = (pocstate->food).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     ((long)uVar9 >> 6) +
                     (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff
            ;
            *puVar2 = *puVar2 | 1L << ((byte)iVar6 & 0x3f);
            pocstate->num_food = pocstate->num_food + 1;
          }
          y = y + 1;
        } while (y < (this->maze_).ysize_);
      }
      x = x + 1;
    } while (x < this_00->xsize_);
  }
  pocstate->power_steps = 0;
  return;
}

Assistant:

void Pocman::NewLevel(PocmanState& pocstate) const {
	pocstate.pocman_pos = pocman_home_;
	for (int g = 0; g < num_ghosts_; g++) {
		pocstate.ghost_pos[g] = ghost_home_;
		pocstate.ghost_pos[g].x += g % 2;
		pocstate.ghost_pos[g].y += g / 2;
		pocstate.ghost_dir[g] = -1;
	}

	pocstate.num_food = 0;
	for (int x = 0; x < maze_.xsize(); x++) {
		for (int y = 0; y < maze_.ysize(); y++) {
			int pocIndex = maze_.Index(x, y);
			// cout << maze_(x, y) << " " << CheckFlag(maze_(x, y), E_SEED) << " " << CheckFlag(maze_(x, y), E_POWER) << endl;
			if (CheckFlag(maze_(x, y), E_SEED)
				&& (CheckFlag(maze_(x, y), E_POWER)
					|| Random::RANDOM.NextDouble() < food_prob_)) {
				pocstate.food[pocIndex] = 1;
				pocstate.num_food++;
			} else {
				pocstate.food[pocIndex] = 0;
			}
		}
	}

	pocstate.power_steps = 0;
}